

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void function(ch_compilation *comp)

{
  _Bool _Var1;
  ch_argcount local_1a55;
  uint8_t local_1a54 [4];
  undefined4 uStack_1a50;
  ch_argcount _argcount;
  uint8_t le_value [4];
  ch_op op_1;
  ch_dataptr function_ptr;
  ch_op op;
  ch_argcount argcount;
  uint8_t scope_mark;
  ch_emit_scope emit_scope;
  ch_token name;
  ch_scope locals_scope;
  ch_compilation *comp_local;
  
  new_localscope();
  comp->scope = (ch_scope *)&name.line;
  consume(comp,TK_POUND,"Expected start of function.",(ch_token *)0x0);
  _Var1 = consume(comp,TK_ID,"Expected function name.",(ch_token *)&emit_scope.parent);
  if (_Var1) {
    ch_emit_create_scope(&comp->emit,(ch_emit_scope *)&op);
    function_ptr._3_1_ = begin_scope(comp);
    function_ptr._2_1_ = function_arglist(comp);
    scope(comp);
    end_scope(comp,function_ptr._3_1_);
    op_1 = OP_RETURN_VOID;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op_1,1);
    le_value = (uint8_t  [4])ch_emit_commit_scope(&comp->emit);
    uStack_1a50 = 0x1f;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&stack0xffffffffffffe5b0,1);
    ch_uint32_to_le_array((uint32_t)le_value,local_1a54);
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,local_1a54,4);
    local_1a55 = function_ptr._2_1_;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_1a55,1);
    if (((comp->emit).emit_scope)->parent != (ch_emit_scope *)0x0) {
      closure(comp);
    }
    comp->scope = comp->scope->parent;
    add_variable(comp,(ch_lexeme)name._0_16_);
  }
  return;
}

Assistant:

void function(ch_compilation *comp) {
  ch_scope locals_scope = new_localscope();
  locals_scope.parent = comp->scope;
  comp->scope = &locals_scope;

  consume(comp, TK_POUND, "Expected start of function.", NULL);
  ch_token name;
  if (!consume(comp, TK_ID, "Expected function name.", &name))
    return;

  ch_emit_scope emit_scope;
  ch_emit_create_scope(&comp->emit, &emit_scope);

  uint8_t scope_mark = begin_scope(comp);
  ch_argcount argcount = function_arglist(comp);
  scope(comp);
  end_scope(comp, scope_mark);

  // Ensure that all functions return
  EMIT_OP(GET_EMIT(comp), OP_RETURN_VOID);

  ch_dataptr function_ptr = ch_emit_commit_scope(&comp->emit);

  EMIT_OP(GET_EMIT(comp), OP_FUNCTION);
  EMIT_PTR(GET_EMIT(comp), function_ptr);
  EMIT_ARGCOUNT(GET_EMIT(comp), argcount);

  if (!CH_EMITTING_GLOBALLY(GET_EMIT(comp))) {
    closure(comp);
  }

  comp->scope = comp->scope->parent;
  add_variable(comp, name.lexeme);
}